

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

int xmlXIncludeLoadTxt(xmlXIncludeCtxtPtr ctxt,xmlXIncludeRefPtr ref)

{
  xmlParserInputBufferPtr in;
  bool bVar1;
  int iVar2;
  xmlParserErrors error;
  int iVar3;
  uint uVar4;
  xmlChar *extra;
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input;
  xmlNodePtr cur;
  xmlXIncludeTxt *pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int l;
  xmlCharEncodingHandlerPtr handler;
  int local_4c;
  xmlCharEncodingHandler *local_48;
  xmlChar *local_40;
  size_t local_38;
  
  pxVar7 = ref->URI;
  local_48 = (xmlCharEncodingHandlerPtr)0x0;
  if (*pxVar7 == '\0') {
    input = (xmlParserInputPtr)0x0;
    xmlXIncludeErr(ctxt,ref->elem,0x647,"text serialization of document not available\n",
                   (xmlChar *)0x0);
    iVar2 = -1;
    ctxt_00 = (xmlParserCtxtPtr)0x0;
    extra = (xmlChar *)0x0;
    goto LAB_001ba7b8;
  }
  if (0 < ctxt->txtNr) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      iVar2 = xmlStrEqual(pxVar7,*(xmlChar **)((long)&ctxt->txtTab->url + lVar8));
      if (iVar2 != 0) {
        cur = xmlNewDocText(ctxt->doc,*(xmlChar **)((long)&ctxt->txtTab->text + lVar8));
        if (cur == (xmlNodePtr)0x0) {
          ctxt->fatalErr = 1;
          ctxt->errNo = 2;
          ctxt->nbErrors = ctxt->nbErrors + 1;
          input = (xmlParserInputPtr)0x0;
          xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                              (xmlError *)0x0);
          ctxt_00 = (xmlParserCtxtPtr)0x0;
          extra = (xmlChar *)0x0;
          cur = (xmlNodePtr)0x0;
        }
        else {
          input = (xmlParserInputPtr)0x0;
          ctxt_00 = (xmlParserCtxtPtr)0x0;
          extra = (xmlChar *)0x0;
        }
        goto LAB_001ba733;
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar9 < ctxt->txtNr);
  }
  if (ref->elem == (xmlNodePtr)0x0) {
    extra = (xmlChar *)0x0;
  }
  else {
    extra = xmlXIncludeGetProp(ctxt,ref->elem,"encoding");
  }
  if ((extra == (xmlChar *)0x0) ||
     (error = xmlOpenCharEncodingHandler((char *)extra,0,&local_48), error == XML_ERR_OK)) {
LAB_001ba546:
    ctxt_00 = xmlNewParserCtxt();
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      ctxt->fatalErr = 1;
      ctxt->errNo = 2;
      ctxt->nbErrors = ctxt->nbErrors + 1;
      xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                          (xmlError *)0x0);
      goto LAB_001ba7b5;
    }
    if (ctxt->errorHandler != (xmlStructuredErrorFunc)0x0) {
      xmlCtxtSetErrorHandler(ctxt_00,ctxt->errorHandler,ctxt->errorCtxt);
    }
    if (ctxt->resourceLoader != (xmlResourceLoader)0x0) {
      xmlCtxtSetResourceLoader(ctxt_00,ctxt->resourceLoader,ctxt->resourceCtxt);
    }
    input = xmlLoadResource(ctxt_00,(char *)pxVar7,(char *)0x0,XML_RESOURCE_XINCLUDE_TEXT);
    if (input != (xmlParserInputPtr)0x0) {
      in = input->buf;
      if (in == (xmlParserInputBufferPtr)0x0) {
LAB_001ba82a:
        cur = (xmlNodePtr)0x0;
      }
      else {
        if (in->encoder != (xmlCharEncodingHandler *)0x0) {
          xmlCharEncCloseFunc(in->encoder);
        }
        in->encoder = local_48;
        local_48 = (xmlCharEncodingHandlerPtr)0x0;
        cur = xmlNewDocText(ctxt->doc,(xmlChar *)0x0);
        if (cur == (xmlNodePtr)0x0) {
          xmlXIncludeErrMemory(ctxt);
          goto LAB_001ba82a;
        }
        do {
          iVar2 = xmlParserInputBufferRead(in,0x1000);
        } while (0 < iVar2);
        if (iVar2 < 0) {
          iVar2 = -1;
          if (in->error == 2) {
            xmlXIncludeErrMemory(ctxt);
          }
          else {
            xmlXIncludeErr(ctxt,(xmlNodePtr)0x0,in->error,"read error",(xmlChar *)0x0);
          }
          goto LAB_001ba7ba;
        }
        local_40 = xmlBufContent(in->buffer);
        local_38 = xmlBufUse(in->buffer);
        iVar2 = 0;
        do {
          iVar3 = (int)local_38;
          if (iVar3 - iVar2 == 0 || iVar3 < iVar2) {
            iVar2 = xmlNodeAddContentLen(cur,local_40,iVar3);
            if (iVar2 < 0) {
              xmlXIncludeErrMemory(ctxt);
            }
            iVar2 = ctxt->txtMax;
            if (iVar2 <= ctxt->txtNr) {
              if (iVar2 < 1) {
                uVar4 = 8;
              }
              else {
                uVar4 = 0xffffffff;
                if (iVar2 < 1000000000) {
                  uVar10 = iVar2 + 1U >> 1;
                  uVar4 = uVar10 + iVar2;
                  if ((int)(1000000000 - uVar10) < iVar2) {
                    uVar4 = 1000000000;
                  }
                }
              }
              if (((int)uVar4 < 0) ||
                 (pxVar5 = (xmlXIncludeTxt *)(*xmlRealloc)(ctxt->txtTab,(ulong)uVar4 << 4),
                 pxVar5 == (xmlXIncludeTxt *)0x0)) {
                xmlXIncludeErrMemory(ctxt);
                break;
              }
              ctxt->txtMax = uVar4;
              ctxt->txtTab = pxVar5;
            }
            pxVar6 = xmlStrdup(cur->content);
            ctxt->txtTab[ctxt->txtNr].text = pxVar6;
            if (pxVar6 == (xmlChar *)0x0 && cur->content != (xmlChar *)0x0) {
              xmlXIncludeErrMemory(ctxt);
            }
            else {
              pxVar7 = xmlStrdup(pxVar7);
              iVar2 = ctxt->txtNr;
              ctxt->txtTab[iVar2].url = pxVar7;
              if (pxVar7 != (xmlChar *)0x0) {
                ctxt->txtNr = iVar2 + 1;
LAB_001ba733:
                ref->inc = cur;
                iVar2 = 0;
                goto LAB_001ba7b8;
              }
              xmlXIncludeErrMemory(ctxt);
              (*xmlFree)(ctxt->txtTab[ctxt->txtNr].text);
            }
            break;
          }
          local_4c = iVar3 - iVar2;
          uVar4 = xmlGetUTF8Char(local_40 + iVar2,&local_4c);
          if ((int)uVar4 < 0) {
LAB_001ba69c:
            xmlXIncludeErr(ctxt,ref->elem,0x648,"%s contains invalid char\n",pxVar7);
            bVar1 = false;
          }
          else {
            if ((int)uVar4 < 0x100) {
              if (((int)uVar4 < 0x20) && ((0xd < uVar4 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0))))
              goto LAB_001ba69c;
            }
            else if ((0xfffff < uVar4 - 0x10000 && 0x1ffd < uVar4 - 0xe000) && 0xd7ff < (int)uVar4)
            goto LAB_001ba69c;
            iVar2 = iVar2 + local_4c;
            bVar1 = true;
          }
        } while (bVar1);
      }
      iVar2 = -1;
      goto LAB_001ba7ba;
    }
    iVar3 = ctxt_00->errNo;
    iVar2 = -1;
    input = (xmlParserInputPtr)0x0;
    if (iVar3 < 0x5dc) {
      input = (xmlParserInputPtr)0x0;
      if (iVar3 != 0) {
        if (iVar3 != 2) goto LAB_001ba809;
        xmlXIncludeErrMemory(ctxt);
        input = (xmlParserInputPtr)0x0;
      }
    }
    else if ((iVar3 != 0x5dc) && (iVar3 != 0x5f4)) {
LAB_001ba809:
      input = (xmlParserInputPtr)0x0;
      xmlXIncludeErr(ctxt,(xmlNodePtr)0x0,iVar3,"load error",(xmlChar *)0x0);
    }
  }
  else {
    if (error == XML_ERR_UNSUPPORTED_ENCODING) {
      xmlXIncludeErr(ctxt,ref->elem,0x64a,"encoding %s not supported\n",extra);
    }
    else {
      if (error == XML_ERR_NO_MEMORY) {
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
        goto LAB_001ba546;
      }
      xmlXIncludeErr(ctxt,ref->elem,error,"unexpected error from iconv or ICU\n",(xmlChar *)0x0);
    }
LAB_001ba7b5:
    input = (xmlParserInputPtr)0x0;
    iVar2 = -1;
    ctxt_00 = (xmlParserCtxtPtr)0x0;
  }
LAB_001ba7b8:
  cur = (xmlNodePtr)0x0;
LAB_001ba7ba:
  xmlFreeNode(cur);
  xmlFreeInputStream(input);
  xmlFreeParserCtxt(ctxt_00);
  xmlCharEncCloseFunc(local_48);
  (*xmlFree)(extra);
  return iVar2;
}

Assistant:

static int
xmlXIncludeLoadTxt(xmlXIncludeCtxtPtr ctxt, xmlXIncludeRefPtr ref) {
    xmlParserInputBufferPtr buf;
    xmlNodePtr node = NULL;
    const xmlChar *url = ref->URI;
    int i;
    int ret = -1;
    xmlChar *encoding = NULL;
    xmlCharEncodingHandlerPtr handler = NULL;
    xmlParserCtxtPtr pctxt = NULL;
    xmlParserInputPtr inputStream = NULL;
    int len;
    int res;
    const xmlChar *content;

    /*
     * Handling of references to the local document are done
     * directly through ctxt->doc.
     */
    if (url[0] == 0) {
	xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_TEXT_DOCUMENT,
		       "text serialization of document not available\n", NULL);
	goto error;
    }

    /*
     * Prevent reloading the document twice.
     */
    for (i = 0; i < ctxt->txtNr; i++) {
	if (xmlStrEqual(url, ctxt->txtTab[i].url)) {
            node = xmlNewDocText(ctxt->doc, ctxt->txtTab[i].text);
            if (node == NULL)
                xmlXIncludeErrMemory(ctxt);
	    goto loaded;
	}
    }

    /*
     * Try to get the encoding if available
     */
    if (ref->elem != NULL) {
	encoding = xmlXIncludeGetProp(ctxt, ref->elem, XINCLUDE_PARSE_ENCODING);
    }
    if (encoding != NULL) {
        xmlParserErrors code;

        code = xmlOpenCharEncodingHandler((const char *) encoding,
                                          /* output */ 0, &handler);

        if (code != XML_ERR_OK) {
            if (code == XML_ERR_NO_MEMORY) {
                xmlXIncludeErrMemory(ctxt);
            } else if (code == XML_ERR_UNSUPPORTED_ENCODING) {
                xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_UNKNOWN_ENCODING,
                               "encoding %s not supported\n", encoding);
                goto error;
            } else {
                xmlXIncludeErr(ctxt, ref->elem, code,
                               "unexpected error from iconv or ICU\n", NULL);
                goto error;
            }
        }
    }

    /*
     * Load it.
     */
    pctxt = xmlNewParserCtxt();
    if (pctxt == NULL) {
        xmlXIncludeErrMemory(ctxt);
        goto error;
    }
    if (ctxt->errorHandler != NULL)
        xmlCtxtSetErrorHandler(pctxt, ctxt->errorHandler, ctxt->errorCtxt);
    if (ctxt->resourceLoader != NULL)
        xmlCtxtSetResourceLoader(pctxt, ctxt->resourceLoader,
                                 ctxt->resourceCtxt);

    inputStream = xmlLoadResource(pctxt, (const char*) url, NULL,
                                  XML_RESOURCE_XINCLUDE_TEXT);
    if (inputStream == NULL) {
        /*
         * ENOENT only produces a warning which isn't reflected in errNo.
         */
        if (pctxt->errNo == XML_ERR_NO_MEMORY)
            xmlXIncludeErrMemory(ctxt);
        else if ((pctxt->errNo != XML_ERR_OK) &&
                 (pctxt->errNo != XML_IO_ENOENT) &&
                 (pctxt->errNo != XML_IO_UNKNOWN))
            xmlXIncludeErr(ctxt, NULL, pctxt->errNo, "load error", NULL);
	goto error;
    }
    buf = inputStream->buf;
    if (buf == NULL)
	goto error;
    if (buf->encoder)
	xmlCharEncCloseFunc(buf->encoder);
    buf->encoder = handler;
    handler = NULL;

    node = xmlNewDocText(ctxt->doc, NULL);
    if (node == NULL) {
        xmlXIncludeErrMemory(ctxt);
	goto error;
    }

    /*
     * Scan all chars from the resource and add the to the node
     */
    do {
        res = xmlParserInputBufferRead(buf, 4096);
    } while (res > 0);
    if (res < 0) {
        if (buf->error == XML_ERR_NO_MEMORY)
            xmlXIncludeErrMemory(ctxt);
        else
            xmlXIncludeErr(ctxt, NULL, buf->error, "read error", NULL);
        goto error;
    }

    content = xmlBufContent(buf->buffer);
    len = xmlBufUse(buf->buffer);
    for (i = 0; i < len;) {
        int cur;
        int l;

        l = len - i;
        cur = xmlGetUTF8Char(&content[i], &l);
        if ((cur < 0) || (!IS_CHAR(cur))) {
            xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_INVALID_CHAR,
                           "%s contains invalid char\n", url);
            goto error;
        }

        i += l;
    }

    if (xmlNodeAddContentLen(node, content, len) < 0)
        xmlXIncludeErrMemory(ctxt);

    if (ctxt->txtNr >= ctxt->txtMax) {
        xmlXIncludeTxt *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->txtMax, sizeof(tmp[0]),
                                  8, XML_MAX_ITEMS);
        if (newSize < 0) {
            xmlXIncludeErrMemory(ctxt);
	    goto error;
        }
        tmp = xmlRealloc(ctxt->txtTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL) {
            xmlXIncludeErrMemory(ctxt);
	    goto error;
        }
        ctxt->txtMax = newSize;
        ctxt->txtTab = tmp;
    }
    ctxt->txtTab[ctxt->txtNr].text = xmlStrdup(node->content);
    if ((node->content != NULL) &&
        (ctxt->txtTab[ctxt->txtNr].text == NULL)) {
        xmlXIncludeErrMemory(ctxt);
        goto error;
    }
    ctxt->txtTab[ctxt->txtNr].url = xmlStrdup(url);
    if (ctxt->txtTab[ctxt->txtNr].url == NULL) {
        xmlXIncludeErrMemory(ctxt);
        xmlFree(ctxt->txtTab[ctxt->txtNr].text);
        goto error;
    }
    ctxt->txtNr++;

loaded:
    /*
     * Add the element as the replacement copy.
     */
    ref->inc = node;
    node = NULL;
    ret = 0;

error:
    xmlFreeNode(node);
    xmlFreeInputStream(inputStream);
    xmlFreeParserCtxt(pctxt);
    xmlCharEncCloseFunc(handler);
    xmlFree(encoding);
    return(ret);
}